

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::notifyAll(Player *this)

{
  _List_node_base *p_Var1;
  ostream *poVar2;
  iterator __begin1;
  _List_node_base *p_Var3;
  
  p_Var1 = (_List_node_base *)this->pObservers;
  p_Var3 = (((_List_base<Observer_*,_std::allocator<Observer_*>_> *)&p_Var1->_M_next)->_M_impl).
           _M_node.super__List_node_base._M_next;
  if (p_Var3 != p_Var1) {
    for (; p_Var3 != p_Var1;
        p_Var3 = (((_List_base<Observer_*,_std::allocator<Observer_*>_> *)&p_Var3->_M_next)->_M_impl
                 )._M_node.super__List_node_base._M_next) {
      (**(code **)(p_Var3[1]._M_next)->_M_next)();
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "[WARNING] - The current player has no observers currently attached to it."
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Player::notifyAll() {
    if(this->pObservers->empty()) {
        std::cout << "[WARNING] - The current player has no observers currently attached to it." << std::endl;
        return;
    }
    for(const auto& observer : *this->pObservers) {
        observer->update();
    }
}